

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::I64ToI32Lowering::create(I64ToI32Lowering *this)

{
  unique_ptr<wasm::I64ToI32Lowering,_std::default_delete<wasm::I64ToI32Lowering>_> local_20 [2];
  I64ToI32Lowering *this_local;
  
  this_local = this;
  std::make_unique<wasm::I64ToI32Lowering>();
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::I64ToI32Lowering,std::default_delete<wasm::I64ToI32Lowering>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<wasm::I64ToI32Lowering,_std::default_delete<wasm::I64ToI32Lowering>_>::~unique_ptr
            (local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<I64ToI32Lowering>();
  }